

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int __thiscall
cmsys::SystemInformationImplementation::CallSwVers
          (SystemInformationImplementation *this,char *arg,string *ver)

{
  string *ver_local;
  char *arg_local;
  SystemInformationImplementation *this_local;
  
  return 0;
}

Assistant:

int SystemInformationImplementation::CallSwVers(const char* arg,
                                                std::string& ver)
{
#ifdef __APPLE__
  std::vector<const char*> args;
  args.push_back("sw_vers");
  args.push_back(arg);
  args.push_back(0);
  ver = this->RunProcess(args);
  this->TrimNewline(ver);
#else
  // avoid C4100
  (void)arg;
  (void)ver;
#endif
  return 0;
}